

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::ensure_post_load_init(CVmObjTable *this,vm_obj_id_t obj)

{
  CVmHashEntryPLI *entry;
  char local_4 [4];
  
  entry = (CVmHashEntryPLI *)CVmHashTable::find(this->post_load_init_table_,local_4,4);
  if (entry != (CVmHashEntryPLI *)0x0) {
    call_post_load_init(entry);
  }
  return;
}

Assistant:

void CVmObjTable::ensure_post_load_init(VMG_ vm_obj_id_t obj)
{
    CVmHashEntryPLI *entry;

    /* find the entry */
    entry = (CVmHashEntryPLI *)
            post_load_init_table_->find((char *)&obj, sizeof(obj));

    /* if we found it, invoke its initialization method */
    if (entry != 0)
        call_post_load_init(vmg_ entry);
}